

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O1

bool __thiscall Network::Client::Buffers::avanceQoS2(Buffers *this,uint32 ID)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = this->maxID;
  if ((ulong)bVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      if ((*(uint *)(this->buffer + uVar2 * 4) & 0x1ffff) == ID) goto LAB_00121b45;
      uVar2 = uVar2 + 1;
    } while (bVar1 != uVar2);
    uVar2 = (ulong)bVar1;
  }
LAB_00121b45:
  if ((byte)uVar2 < bVar1) {
    *(uint *)(this->buffer + (uVar2 & 0xff) * 4) =
         *(uint *)(this->buffer + (uVar2 & 0xff) * 4) | 0x40000000;
  }
  return (byte)uVar2 < bVar1;
}

Assistant:

inline bool avanceQoS2(uint32 ID)   { uint8 p = findID(ID); if (p == maxID) return false; packetsID()[p] |= 0x40000000; return true; }